

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ITypeReader.cpp
# Opt level: O1

void __thiscall ITypeReader::getWord(ITypeReader *this,string *str)

{
  pointer pcVar1;
  char ch;
  bool bVar2;
  char cVar3;
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  do {
    ch = std::istream::get();
    if (ch == -1) {
LAB_00109e78:
      bVar2 = IDictionary::isBlankSep((str->_M_dataplus)._M_p[str->_M_string_length - 1]);
      if (bVar2) {
        do {
          std::__cxx11::string::substr((ulong)local_48,(ulong)str);
          std::__cxx11::string::operator=((string *)str,(string *)local_48);
          if (local_48[0] != local_38) {
            operator_delete(local_48[0]);
          }
          bVar2 = IDictionary::isBlankSep((str->_M_dataplus)._M_p[str->_M_string_length - 1]);
        } while (bVar2);
      }
      pcVar1 = (str->_M_dataplus)._M_p;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar1,pcVar1 + str->_M_string_length);
      bVar2 = IDictionary::isBaseType(&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      if (!bVar2) {
        std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0x10c0b4);
      }
      if (str->_M_string_length != 0) {
        std::__cxx11::string::_M_assign((string *)&this->m_last);
      }
      return;
    }
    bVar2 = IDictionary::isLetterOrNumberOrDL(ch);
    cVar3 = (char)str;
    if (!bVar2) {
      bVar2 = IDictionary::isBlankSep(ch);
      if ((~bVar2 & ch != '*') == 0) {
        do {
          std::__cxx11::string::push_back(cVar3);
          if (ch == '\n') {
            std::__cxx11::string::push_back(cVar3);
          }
          ch = std::istream::get();
          bVar2 = IDictionary::isBlankSep(ch);
        } while (ch == '*' || bVar2);
      }
      goto LAB_00109e78;
    }
    std::__cxx11::string::push_back(cVar3);
  } while( true );
}

Assistant:

void ITypeReader::getWord(std::string &str) {
    char tempChar;

    while((tempChar = this->m_ifs->get()) != EOF)
    {
        if(IDictionary::isLetterOrNumberOrDL(tempChar))
        {
            str+=tempChar;
        }
        else
        {
            while(IDictionary::isBlankSep(tempChar)||tempChar=='*')
            {
                str+=tempChar;
                if(tempChar=='\n')
                    str+='\n';
                tempChar = this->m_ifs->get();
            }
            break;
        }
    }
    while(IDictionary::isBlankSep(str[str.length()-1]))
        str=str.substr(0,str.length()-1);

    if(!IDictionary::isBaseType(str))
    {
        str="";
    }

    if(!str.empty())
    {
        m_last=str;
    }
}